

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O3

int cuddGa(DdManager *table,int lower,int upper)

{
  size_t __size;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  st__table *table_00;
  void *pvVar6;
  void *__s;
  double *__ptr;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  char *value;
  double dVar21;
  int index;
  int *pointer;
  int local_74;
  ulong local_70;
  int local_64;
  double local_60;
  int local_54;
  size_t local_50;
  DdManager *local_48;
  long local_40;
  int *local_38;
  
  iVar4 = cuddSifting(table,lower,upper);
  iVar14 = 0;
  if (iVar4 == 0) {
    return 0;
  }
  numvars = (upper - lower) + 1;
  uVar16 = 0x78;
  if (numvars * 3 < 0x78) {
    uVar16 = numvars * 3;
  }
  if (table->populationSize != 0) {
    uVar16 = table->populationSize;
  }
  uVar9 = 4;
  if (4 < (int)uVar16) {
    uVar9 = uVar16;
  }
  popsize = uVar9;
  local_70 = (ulong)(uint)lower;
  piVar5 = (int *)malloc((long)(int)(((upper - lower) + 2) * (uVar9 + 2)) << 2);
  storedd = piVar5;
  if (piVar5 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  repeat = (int *)calloc(1,(ulong)uVar9 << 2);
  if (repeat == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    free(piVar5);
    storedd = (int *)0x0;
    return 0;
  }
  table_00 = st__init_table(array_compare,array_hash);
  piVar5 = storedd;
  computed = table_00;
  if (table_00 == (st__table *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_00787556:
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    if (repeat == (int *)0x0) {
      return iVar14;
    }
    free(repeat);
    repeat = (int *)0x0;
    return iVar14;
  }
  lVar7 = (long)numvars;
  if (0 < lVar7) {
    piVar2 = table->invperm;
    lVar17 = 0;
    do {
      piVar5[lVar17] = piVar2[(int)local_70 + lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar7 != lVar17);
  }
  piVar5[lVar7] = table->keys - table->isolated;
  iVar4 = st__insert(table_00,(char *)piVar5,(char *)0x0);
  piVar5 = repeat;
  if (iVar4 == -10000) {
LAB_007874e7:
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    piVar5 = repeat;
    if (repeat == (int *)0x0) goto LAB_007876c8;
  }
  else {
    *repeat = *repeat + 1;
    piVar2 = storedd;
    uVar20 = (ulong)numvars;
    if (0 < (long)uVar20) {
      iVar4 = numvars * 2;
      piVar3 = table->invperm;
      uVar15 = 0;
      do {
        piVar2[iVar4] = piVar3[(long)(int)local_70 + uVar15];
        uVar15 = uVar15 + 1;
        iVar4 = iVar4 + -1;
      } while (uVar20 != uVar15);
    }
    pvVar6 = malloc(uVar20 << 2);
    if (pvVar6 != (void *)0x0) {
      uVar15 = (ulong)(uint)popsize;
      iVar4 = (int)local_70;
      local_64 = upper;
      if (2 < popsize) {
        iVar14 = 2;
        do {
          if (0 < (int)uVar20) {
            iVar10 = 0;
            memset(pvVar6,0,(uVar20 & 0xffffffff) << 2);
            do {
              do {
                lVar17 = (long)numvars;
                lVar7 = Cudd_Random();
                lVar7 = lVar7 % lVar17;
              } while (*(int *)((long)pvVar6 + lVar7 * 4) != 0);
              *(undefined4 *)((long)pvVar6 + lVar7 * 4) = 1;
              iVar11 = numvars;
              uVar20 = (ulong)(uint)numvars;
              storedd[(numvars + 1) * iVar14 + iVar10] = table->invperm[(int)lVar7 + iVar4];
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar11);
            uVar15 = (ulong)(uint)popsize;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar15);
      }
      free(pvVar6);
      iVar14 = local_64;
      if (1 < (int)uVar15) {
        value = (char *)0x1;
        lVar7 = 4;
        do {
          iVar10 = (int)value;
          iVar4 = build_dd(table,iVar10,(int)local_70,iVar14);
          if (iVar4 == 0) goto LAB_007874e7;
          iVar4 = st__lookup_int(computed,(char *)(storedd + (long)iVar10 * ((long)numvars + 1)),
                                 &local_74);
          if (iVar4 == 0) {
            iVar4 = st__insert(computed,(char *)(storedd + (long)iVar10 * ((long)numvars + 1)),value
                              );
            if (iVar4 == -10000) goto LAB_007874e7;
            piVar5 = (int *)((long)repeat + lVar7);
          }
          else {
            piVar5 = repeat + local_74;
          }
          *piVar5 = *piVar5 + 1;
          value = value + 1;
          uVar15 = (ulong)popsize;
          lVar7 = lVar7 + 4;
        } while ((long)value < (long)uVar15);
        iVar4 = (int)local_70;
      }
      find_best();
      cross = table->numberXovers;
      if (table->numberXovers == 0) {
        cross = 0x3c;
        if (numvars * 3 < 0x3c) {
          cross = numvars * 3;
        }
      }
      if (0 < cross) {
        iVar10 = 0;
        local_48 = table;
        do {
          iVar4 = table->size;
          __size = (long)iVar4 * 4;
          pvVar6 = malloc(__size);
          if (pvVar6 == (void *)0x0) {
LAB_00787d32:
            table->errorCode = CUDD_MEMORY_OUT;
            goto LAB_007874e7;
          }
          local_54 = iVar10;
          local_40 = (long)iVar4;
          __s = malloc(__size);
          if (__s == (void *)0x0) {
LAB_00787d2a:
            free(pvVar6);
            goto LAB_00787d32;
          }
          local_50 = __size;
          __ptr = (double *)malloc((long)(int)uVar15 << 3);
          piVar5 = storedd;
          if (__ptr == (double *)0x0) {
            free(pvVar6);
            pvVar6 = __s;
            goto LAB_00787d2a;
          }
          lVar7 = (long)numvars;
          *__ptr = 1.0 / (double)storedd[lVar7];
          if (1 < (int)uVar15) {
            dVar21 = *__ptr;
            piVar5 = piVar5 + lVar7 * 2 + 1;
            uVar20 = 1;
            do {
              dVar21 = dVar21 + 1.0 / (double)*piVar5;
              __ptr[uVar20] = dVar21;
              uVar20 = uVar20 + 1;
              piVar5 = piVar5 + lVar7 + 1;
            } while ((uVar15 & 0xffffffff) != uVar20);
          }
          local_60 = __ptr[lVar7 + -1];
          lVar7 = Cudd_Random();
          uVar20 = (ulong)(uint)popsize;
          uVar15 = 0;
          if (0 < popsize) {
            do {
              if (((double)lVar7 * local_60) / 2147483561.0 <= __ptr[uVar15]) goto LAB_00787929;
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
            uVar15 = (ulong)(uint)popsize;
          }
LAB_00787929:
          do {
            local_60 = __ptr[(long)(int)uVar20 + -1];
            lVar7 = Cudd_Random();
            uVar20 = (ulong)(uint)popsize;
            uVar12 = 0;
            if (0 < popsize) {
              do {
                if (((double)lVar7 * local_60) / 2147483561.0 <= __ptr[uVar12]) goto LAB_00787974;
                uVar12 = uVar12 + 1;
              } while (uVar20 != uVar12);
              uVar12 = (ulong)(uint)popsize;
            }
LAB_00787974:
          } while ((int)uVar12 == (int)uVar15);
          free(__ptr);
          lVar17 = (long)numvars;
          lVar7 = Cudd_Random();
          uVar20 = lVar7 % lVar17;
          do {
            lVar17 = (long)numvars;
            lVar7 = Cudd_Random();
            uVar8 = lVar7 % lVar17;
          } while (uVar20 == uVar8);
          if (0 < (int)local_40) {
            memset(pvVar6,0xff,local_50);
            memset(__s,0xff,local_50);
          }
          piVar5 = storedd;
          iVar4 = numvars + 1;
          iVar11 = (int)uVar12 * iVar4;
          local_60 = (double)(ulong)(uint)popsize;
          iVar10 = popsize * iVar4;
          iVar19 = (int)uVar15 * iVar4;
          iVar4 = (popsize + 1) * iVar4;
          iVar14 = numvars + -1;
          uVar15 = uVar20 & 0xffffffff;
          do {
            iVar1 = (int)uVar15;
            iVar18 = piVar5[iVar1 + iVar11];
            piVar5[iVar1 + iVar10] = iVar18;
            *(int *)((long)pvVar6 + (long)iVar18 * 4) = iVar1;
            iVar18 = piVar5[iVar1 + iVar19];
            piVar5[iVar1 + iVar4] = iVar18;
            *(int *)((long)__s + (long)iVar18 * 4) = iVar1;
            uVar15 = (ulong)(iVar1 + 1);
            if (iVar1 == iVar14) {
              uVar15 = 0;
            }
          } while ((int)uVar15 != (int)uVar8);
          do {
            iVar18 = (int)uVar8;
            uVar15 = uVar8 & 0xffffffff;
            do {
              iVar1 = piVar5[(int)uVar15 + iVar19];
              uVar16 = *(uint *)((long)pvVar6 + (long)iVar1 * 4);
              uVar15 = (ulong)uVar16;
            } while (uVar16 != 0xffffffff);
            piVar5[iVar10 + iVar18] = iVar1;
            *(int *)((long)pvVar6 + (long)iVar1 * 4) = iVar18;
            uVar8 = uVar8 & 0xffffffff;
            do {
              iVar1 = piVar5[(int)uVar8 + iVar11];
              uVar16 = *(uint *)((long)__s + (long)iVar1 * 4);
              uVar8 = (ulong)uVar16;
            } while (uVar16 != 0xffffffff);
            piVar5[iVar4 + iVar18] = iVar1;
            *(int *)((long)__s + (long)iVar1 * 4) = iVar18;
            uVar16 = iVar18 + 1;
            if (iVar18 == iVar14) {
              uVar16 = 0;
            }
            uVar8 = (ulong)uVar16;
          } while (uVar16 != (uint)uVar20);
          free(pvVar6);
          free(__s);
          table = local_48;
          iVar4 = (int)local_70;
          dVar21 = local_60;
          iVar14 = local_64;
          do {
            iVar11 = SUB84(dVar21,0);
            iVar10 = build_dd(table,iVar11,iVar4,iVar14);
            iVar14 = local_64;
            if (iVar10 == 0) goto LAB_007874e7;
            uVar20 = 0;
            do {
              uVar15 = uVar20;
              uVar20 = uVar15 + 1;
            } while (1 < repeat[uVar15]);
            large = (int)uVar15;
            lVar17 = (long)numvars;
            lVar7 = lVar17 + 1;
            iVar19 = (int)(uVar15 + 1);
            iVar10 = (int)lVar7;
            if (iVar19 < popsize) {
              piVar5 = (int *)((long)storedd + (long)iVar19 * lVar7 * 4 + lVar17 * 4);
              lVar13 = 0;
              do {
                if (storedd[(int)uVar15 * iVar10 + lVar17] <= *piVar5) {
                  uVar15 = uVar15 & 0xffffffff;
                  if (repeat[iVar19 + lVar13] < 2) {
                    uVar15 = (ulong)(uint)(iVar19 + (int)lVar13);
                  }
                }
                large = (int)uVar15;
                lVar13 = lVar13 + 1;
                piVar5 = piVar5 + lVar7;
              } while (popsize - iVar19 != (int)lVar13);
            }
            if (storedd[iVar10 * iVar11 + numvars] < storedd[numvars + large * iVar10]) {
              piVar5 = &local_74;
              iVar10 = st__lookup_int(computed,(char *)(storedd + large * iVar10),piVar5);
              piVar2 = repeat;
              if (iVar10 == 0) goto LAB_007874e7;
              repeat[local_74] = repeat[local_74] + -1;
              if (piVar2[local_74] == 0) {
                local_38 = storedd + ((long)numvars + 1) * (long)local_74;
                iVar10 = st__delete(computed,(char **)&local_38,(char **)0x0);
                if (iVar10 == 0) goto LAB_007874e7;
              }
              piVar2 = storedd;
              uVar16 = numvars + 1;
              if (numvars < 0) {
                lVar7 = (long)(int)(large * uVar16);
              }
              else {
                lVar7 = (long)(int)(large * uVar16);
                uVar20 = 0;
                do {
                  piVar2[lVar7 + uVar20] = piVar2[(long)(int)(uVar16 * iVar11) + uVar20];
                  uVar20 = uVar20 + 1;
                } while (uVar16 != uVar20);
              }
              iVar10 = st__lookup_int(computed,(char *)(piVar2 + lVar7),piVar5);
              if (iVar10 == 0) {
                iVar10 = st__insert(computed,(char *)(storedd + ((long)numvars + 1) * (long)large),
                                    (char *)(long)large);
                piVar5 = &large;
                if (iVar10 == -10000) goto LAB_007874e7;
              }
              repeat[*piVar5] = repeat[*piVar5] + 1;
            }
            uVar15 = (ulong)(uint)popsize;
            dVar21 = (double)(ulong)(iVar11 + 1);
          } while (iVar11 <= popsize);
          iVar10 = local_54 + 1;
        } while (iVar10 < cross);
      }
      iVar10 = find_best();
      st__free_table(computed);
      computed = (st__table *)0x0;
      iVar14 = build_dd(table,iVar10,iVar4,iVar14);
      goto LAB_00787556;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
  }
  free(piVar5);
  repeat = (int *)0x0;
LAB_007876c8:
  st__free_table(computed);
  return 0;
}

Assistant:

int
cuddGa(
  DdManager * table /* manager */,
  int  lower /* lowest level to be reordered */,
  int  upper /* highest level to be reorderded */)
{
    int         i,n,m;          /* dummy/loop vars */
    int         index;
#ifdef DD_STATS
    double      average_fitness;
#endif
    int         small;          /* index of smallest DD in population */

    /* Do an initial sifting to produce at least one reasonable individual. */
    if (!cuddSifting(table,lower,upper)) return(0);

    /* Get the initial values. */
    numvars = upper - lower + 1; /* number of variables to be reordered */
    if (table->populationSize == 0) {
        popsize = 3 * numvars;  /* population size is 3 times # of vars */
        if (popsize > 120) {
            popsize = 120;      /* Maximum population size is 120 */
        }
    } else {
        popsize = table->populationSize;  /* user specified value */
    }
    if (popsize < 4) popsize = 4;       /* enforce minimum population size */

    /* Allocate population table. */
    storedd = ABC_ALLOC(int,(popsize+2)*(numvars+1));
    if (storedd == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    /* Initialize the computed table. This table is made up of two data
    ** structures: A hash table with the key given by the order, which says
    ** if a given order is present in the population; and the repeat
    ** vector, which says how many copies of a given order are stored in
    ** the population table. If there are multiple copies of an order, only
    ** one has a repeat count greater than 1. This copy is the one pointed
    ** by the computed table.
    */
    repeat = ABC_ALLOC(int,popsize);
    if (repeat == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        return(0);
    }
    for (i = 0; i < popsize; i++) {
        repeat[i] = 0;
    }
    computed = st__init_table(array_compare,array_hash);
    if (computed == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        return(0);
    }

    /* Copy the current DD and its size to the population table. */
    for (i = 0; i < numvars; i++) {
        STOREDD(0,i) = table->invperm[i+lower]; /* order of initial DD */
    }
    STOREDD(0,numvars) = table->keys - table->isolated; /* size of initial DD */

    /* Store the initial order in the computed table. */
    if ( st__insert(computed,(char *)storedd,(char *) 0) == st__OUT_OF_MEM) {
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    repeat[0]++;

    /* Insert the reverse order as second element of the population. */
    for (i = 0; i < numvars; i++) {
        STOREDD(1,numvars-1-i) = table->invperm[i+lower]; /* reverse order */
    }

    /* Now create the random orders. make_random fills the population
    ** table with random permutations. The successive loop builds and sifts
    ** the DDs for the reverse order and each random permutation, and stores
    ** the results in the computed table.
    */
    if (!make_random(table,lower)) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    for (i = 1; i < popsize; i++) {
        result = build_dd(table,i,lower,upper); /* build and sift order */
        if (!result) {
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        if ( st__lookup_int(computed,(char *)&STOREDD(i,0),&index)) {
            repeat[index]++;
        } else {
            if ( st__insert(computed,(char *)&STOREDD(i,0),(char *)(long)i) ==
            st__OUT_OF_MEM) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            repeat[i]++;
        }
    }

#if 0
#ifdef DD_STATS
    /* Print the initial population. */
    (void) fprintf(table->out,"Initial population after sifting\n");
    for (m = 0; m < popsize; m++) {
        for (i = 0; i < numvars; i++) {
            (void) fprintf(table->out," %2d",STOREDD(m,i));
        }
        (void) fprintf(table->out," : %3d (%d)\n",
                       STOREDD(m,numvars),repeat[m]);
    }
#endif
#endif

    small = find_best();
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nInitial population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Decide how many crossovers should be tried. */
    if (table->numberXovers == 0) {
        cross = 3*numvars;
        if (cross > 60) {       /* do a maximum of 50 crossovers */
            cross = 60;
        }
    } else {
        cross = table->numberXovers;      /* use user specified value */
    }

    /* Perform the crossovers to get the best order. */
    for (m = 0; m < cross; m++) {
        if (!PMX(table->size)) {        /* perform one crossover */
            table->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        /* The offsprings are left in the last two entries of the
        ** population table. These are now considered in turn.
        */
        for (i = popsize; i <= popsize+1; i++) {
            result = build_dd(table,i,lower,upper); /* build and sift child */
            if (!result) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            large = largest();  /* find the largest DD in population */

            /* If the new child is smaller than the largest DD in the current
            ** population, enter it into the population in place of the
            ** largest DD.
            */
            if (STOREDD(i,numvars) < STOREDD(large,numvars)) {
                /* Look up the largest DD in the computed table.
                ** Decrease its repetition count. If the repetition count
                ** goes to 0, remove the largest DD from the computed table.
                */
                result = st__lookup_int(computed,(char *)&STOREDD(large,0),
                                       &index);
                if (!result) {
                    ABC_FREE(storedd);
                    ABC_FREE(repeat);
                    st__free_table(computed);
                    return(0);
                }
                repeat[index]--;
                if (repeat[index] == 0) {
                    int *pointer = &STOREDD(index,0);
                    result = st__delete(computed, (const char **)&pointer, NULL);
                    if (!result) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                }
                /* Copy the new individual to the entry of the
                ** population table just made available and update the
                ** computed table.
                */
                for (n = 0; n <= numvars; n++) {
                    STOREDD(large,n) = STOREDD(i,n);
                }
                if ( st__lookup_int(computed,(char *)&STOREDD(large,0),
                                  &index)) {
                    repeat[index]++;
                } else {
                    if ( st__insert(computed,(char *)&STOREDD(large,0),
                    (char *)(long)large) == st__OUT_OF_MEM) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                    repeat[large]++;
                }
            }
        }
    }

    /* Find the smallest DD in the population and build it;
    ** that will be the result.
    */
    small = find_best();

    /* Print stats on the final population. */
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nFinal population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Clean up, build the result DD, and return. */
    st__free_table(computed);
    computed = NULL;
    result = build_dd(table,small,lower,upper);
    ABC_FREE(storedd);
    ABC_FREE(repeat);
    return(result);

}